

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O3

void __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::ModuleRunnerBase
          (ModuleRunnerBase<wasm::ModuleRunner> *this,Module *wasm,
          ExternalInterface *externalInterface,
          map<wasm::Name,_std::shared_ptr<wasm::ModuleRunner>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<wasm::ModuleRunner>_>_>_>
          *linkedInstances_)

{
  _Rb_tree_header *p_Var1;
  pointer puVar2;
  Global *global;
  char *pcVar3;
  size_t sVar4;
  pointer pNVar5;
  unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *import;
  pointer puVar6;
  Name name;
  Literals local_c0;
  undefined1 auStack_88 [8];
  Literals arguments;
  
  (this->super_ExpressionRunner<wasm::ModuleRunner>).module = wasm;
  (this->super_ExpressionRunner<wasm::ModuleRunner>).maxDepth = 0;
  (this->super_ExpressionRunner<wasm::ModuleRunner>).depth = 0;
  (this->super_ExpressionRunner<wasm::ModuleRunner>).maxLoopIterations = 0;
  (this->super_ExpressionRunner<wasm::ModuleRunner>)._vptr_ExpressionRunner =
       (_func_int **)&PTR__ModuleRunnerBase_00d72650;
  this->wasm = wasm;
  p_Var1 = &(this->globals)._M_t._M_impl.super__Rb_tree_header;
  (this->globals)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->globals)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->globals)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->globals)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->globals)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->multiValues).super__Vector_base<wasm::Literals,_std::allocator<wasm::Literals>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->multiValues).super__Vector_base<wasm::Literals,_std::allocator<wasm::Literals>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->multiValues).super__Vector_base<wasm::Literals,_std::allocator<wasm::Literals>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->callDepth = 0;
  (this->functionStack).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->functionStack).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->functionStack).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->droppedSegments)._M_h._M_buckets = &(this->droppedSegments)._M_h._M_single_bucket;
  (this->droppedSegments)._M_h._M_bucket_count = 1;
  (this->droppedSegments)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->droppedSegments)._M_h._M_element_count = 0;
  (this->droppedSegments)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->droppedSegments)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->droppedSegments)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->memorySizes)._M_h._M_buckets = &(this->memorySizes)._M_h._M_single_bucket;
  (this->memorySizes)._M_h._M_bucket_count = 1;
  (this->memorySizes)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->memorySizes)._M_h._M_element_count = 0;
  (this->memorySizes)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  memset(&(this->memorySizes)._M_h._M_rehash_policy._M_next_resize,0,0x198);
  this->externalInterface = externalInterface;
  std::
  _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::shared_ptr<wasm::ModuleRunner>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::shared_ptr<wasm::ModuleRunner>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<wasm::ModuleRunner>_>_>_>
  ::_Rb_tree(&(this->linkedInstances)._M_t,&linkedInstances_->_M_t);
  (*externalInterface->_vptr_ExternalInterface[3])(externalInterface,&this->globals,wasm);
  puVar6 = (wasm->globals).
           super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar2 = (wasm->globals).
           super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  auStack_88 = (undefined1  [8])this;
  if (puVar6 != puVar2) {
    do {
      global = (puVar6->_M_t).
               super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
               super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
               super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl;
      if ((global->super_Importable).module.super_IString.str._M_str == (char *)0x0) {
        ModuleRunnerBase::anon_class_8_1_8991fb9c::operator()
                  ((anon_class_8_1_8991fb9c *)auStack_88,global);
      }
      puVar6 = puVar6 + 1;
    } while (puVar6 != puVar2);
  }
  (*externalInterface->_vptr_ExternalInterface[2])(externalInterface,wasm,this);
  initializeTableContents(this);
  initializeMemoryContents(this);
  pcVar3 = (wasm->start).super_IString.str._M_str;
  if (pcVar3 != (char *)0x0) {
    arguments.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id = 0;
    arguments.super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    arguments.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.i64 = 0;
    arguments.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.func.super_IString.str
    ._M_str = (char *)0x0;
    auStack_88 = (undefined1  [8])0x0;
    arguments.super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
    arguments.super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    sVar4 = (wasm->start).super_IString.str._M_len;
    this->callDepth = 0;
    pNVar5 = (this->functionStack).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((this->functionStack).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
        super__Vector_impl_data._M_finish != pNVar5) {
      (this->functionStack).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
      super__Vector_impl_data._M_finish = pNVar5;
    }
    name.super_IString.str._M_str = pcVar3;
    name.super_IString.str._M_len = sVar4;
    callFunctionInternal(&local_c0,this,name,(Literals *)auStack_88);
    std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
              (&local_c0.super_SmallVector<wasm::Literal,_1UL>.flexible);
    Literal::~Literal(local_c0.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems);
    std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
              ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)
               &arguments.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type);
    Literal::~Literal((Literal *)&arguments);
  }
  return;
}

Assistant:

ModuleRunnerBase(
    Module& wasm,
    ExternalInterface* externalInterface,
    std::map<Name, std::shared_ptr<SubType>> linkedInstances_ = {})
    : ExpressionRunner<SubType>(&wasm), wasm(wasm),
      externalInterface(externalInterface), linkedInstances(linkedInstances_) {
    // import globals from the outside
    externalInterface->importGlobals(globals, wasm);
    // generate internal (non-imported) globals
    ModuleUtils::iterDefinedGlobals(wasm, [&](Global* global) {
      globals[global->name] = self()->visit(global->init).values;
    });

    // initialize the rest of the external interface
    externalInterface->init(wasm, *self());

    initializeTableContents();
    initializeMemoryContents();

    // run start, if present
    if (wasm.start.is()) {
      Literals arguments;
      callFunction(wasm.start, arguments);
    }
  }